

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int fffrwc(fitsfile *fptr,char *expr,char *timeCol,char *parCol,char *valCol,long ntimes,
          double *times,char *time_status,int *status)

{
  size_t __size;
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  void *pvVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  iteratorCol *piVar10;
  bool bVar11;
  long alen;
  long local_1f0;
  long local_1e8;
  int naxis;
  int typecode;
  long width;
  ParseData lParse;
  parseInfo Info;
  long naxes [5];
  
  iVar2 = *status;
  if (iVar2 == 0) {
    memset(&Info,0,0x90);
    iVar2 = ffiprs(fptr,1,expr,5,&Info.datatype,&local_1e8,&naxis,naxes,&lParse,status);
    if (iVar2 == 0) {
      ffgcno(fptr,0,timeCol,&lParse.timeCol,status);
      ffgcno(fptr,0,parCol,&lParse.parCol,status);
      ffgcno(fptr,0,valCol,&lParse.valCol,status);
      iVar1 = lParse.nCols;
      iVar2 = *status;
      if (iVar2 == 0) {
        lVar3 = local_1e8;
        iVar8 = 0;
        if (local_1e8 < 0) {
          lVar3 = -local_1e8;
          lParse.nCols = 0;
          iVar8 = iVar1;
        }
        if (lVar3 == 1 && Info.datatype == 0xe) {
          lVar3 = (long)lParse.nCols;
          local_1f0 = ntimes + 1;
          __size = ntimes * 8 + 8;
          iVar1 = lParse.nCols + -2;
          do {
            iVar7 = iVar1;
            piVar10 = lParse.colData;
            bVar11 = lVar3 == 0;
            lVar3 = lVar3 + -1;
            if (bVar11) {
              iVar2 = fits_uncompress_hkdata(&lParse,fptr,ntimes,times,status);
              if (iVar2 == 0) {
                if (local_1e8 < 0) {
                  if (ntimes != 0) {
                    memset(time_status,*(int *)&lParse.Nodes[lParse.resultNode].value.data,ntimes);
                  }
                }
                else {
                  Info.dataPtr = time_status;
                  Info.nullPtr = (void *)0x0;
                  Info.maxRows = ntimes;
                  iVar2 = fits_parser_workfn(ntimes,0,1,ntimes,lParse.nCols,lParse.colData,&Info);
                  *status = iVar2;
                }
              }
              lVar3 = (long)lParse.nCols;
              if (lVar3 != 0) {
                lVar9 = lVar3 * 0x110 + -0xb0;
                do {
                  if (*(int *)((lParse.colData)->colname + lVar9 + -0x18) == 0x10) {
                    if ((void *)**(undefined8 **)((lParse.colData)->colname + lVar9 + -0xc) ==
                        (void *)0x0) {
                      printf("invalid free(((char **)lParse.colData[parNo].array)[0]) at %s:%d\n",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                             ,0x7f7);
                    }
                    else {
                      free((void *)**(undefined8 **)((lParse.colData)->colname + lVar9 + -0xc));
                    }
                  }
                  if (*(void **)((lParse.colData)->colname + lVar9 + -0xc) == (void *)0x0) {
                    printf("invalid free(lParse.colData[parNo].array) at %s:%d\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                           ,0x7f8);
                  }
                  else {
                    free(*(void **)((lParse.colData)->colname + lVar9 + -0xc));
                  }
                  lVar3 = lVar3 + -1;
                  lVar9 = lVar9 + -0x110;
                } while (lVar3 != 0);
              }
              if (local_1e8 < 0) {
                lParse.nCols = iVar8;
              }
              ffcprs(&lParse);
              goto LAB_001471b2;
            }
            iVar2 = lParse.colData[lVar3].datatype;
            if (iVar2 == 0x10) {
              iVar2 = ffgtcl(fptr,lParse.valCol,&typecode,&alen,&width,status);
              if (iVar2 != 0) goto LAB_00146f5b;
              lVar9 = alen + 1;
              alen = lVar9;
              puVar4 = (undefined8 *)malloc(__size);
              piVar10 = lParse.colData;
              lParse.colData[lVar3].array = puVar4;
              if (puVar4 != (undefined8 *)0x0) {
                pvVar5 = malloc(lVar9 * local_1f0);
                *puVar4 = pvVar5;
                if (pvVar5 != (void *)0x0) {
                  if (0 < ntimes) {
                    lVar6 = 0;
                    do {
                      *(long *)((long)lParse.colData[lVar3].array + lVar6 * 8 + 8) =
                           *(long *)((long)lParse.colData[lVar3].array + lVar6 * 8) + lVar9;
                      lVar6 = lVar6 + 1;
                      piVar10 = lParse.colData;
                    } while (ntimes != lVar6);
                  }
                  **piVar10[lVar3].array = 0;
                  goto LAB_00146f5b;
                }
                free(piVar10[lVar3].array);
              }
LAB_00147105:
              *status = 0x71;
              iVar2 = 0x71;
              break;
            }
            if (iVar2 == 0x52) {
              puVar4 = (undefined8 *)malloc(__size);
              piVar10[lVar3].array = puVar4;
              if (puVar4 == (undefined8 *)0x0) goto LAB_00147105;
              *puVar4 = 0xb8a83e285ebab4b7;
            }
            else if (iVar2 == 0x29) {
              puVar4 = (undefined8 *)malloc(__size);
              piVar10[lVar3].array = puVar4;
              if (puVar4 == (undefined8 *)0x0) goto LAB_00147105;
              *puVar4 = 0x4995cdd1;
            }
LAB_00146f5b:
            iVar2 = *status;
            iVar1 = iVar7 + -1;
          } while (iVar2 == 0);
          if ((int)lVar3 != 0) {
            lVar3 = (long)iVar7 + 1;
            lVar9 = (long)iVar7 * 0x110 + 0x60;
            do {
              if (*(int *)((lParse.colData)->colname + lVar9 + -0x18) == 0x10) {
                if ((void *)**(undefined8 **)((lParse.colData)->colname + lVar9 + -0xc) ==
                    (void *)0x0) {
                  printf("invalid free(((char **)lParse.colData[parNo].array)[0]) at %s:%d\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                         ,0x7d7);
                }
                else {
                  free((void *)**(undefined8 **)((lParse.colData)->colname + lVar9 + -0xc));
                }
              }
              if (*(void **)((lParse.colData)->colname + lVar9 + -0xc) == (void *)0x0) {
                printf("invalid free(lParse.colData[parNo].array) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                       ,0x7d8);
              }
              else {
                free(*(void **)((lParse.colData)->colname + lVar9 + -0xc));
              }
              lVar9 = lVar9 + -0x110;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
LAB_001471b2:
            iVar2 = *status;
          }
        }
        else {
          ffcprs(&lParse);
          ffpmsg("Expression does not evaluate to a logical scalar.");
          *status = 0x1b0;
          iVar2 = 0x1b0;
        }
      }
    }
    else {
      ffcprs(&lParse);
      iVar2 = *status;
    }
  }
  return iVar2;
}

Assistant:

int fffrwc( fitsfile *fptr,        /* I - Input FITS file                    */
            char     *expr,        /* I - Boolean expression                 */
            char     *timeCol,     /* I - Name of time column                */
            char     *parCol,      /* I - Name of parameter column           */
            char     *valCol,      /* I - Name of value column               */
            long     ntimes,       /* I - Number of distinct times in file   */
            double   *times,       /* O - Array of times in file             */
            char     *time_status, /* O - Array of boolean results           */
            int      *status )     /* O - Error status                       */
/*                                                                           */
/* Evaluate a boolean expression for each time in a compressed file,         */
/* returning an array of flags indicating which times evaluated to TRUE/FALSE*/
/*---------------------------------------------------------------------------*/
{
   parseInfo Info;
   long alen, width;
   int parNo, typecode;
   int naxis, constant, nCol=0;
   long nelem, naxes[MAXDIMS], elem;
   char result;
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( fptr, 1, expr, MAXDIMS, &Info.datatype, &nelem,
               &naxis, naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }

   fits_get_colnum( fptr, CASEINSEN, timeCol, &lParse.timeCol, status );
   fits_get_colnum( fptr, CASEINSEN, parCol,  &lParse.parCol , status );
   fits_get_colnum( fptr, CASEINSEN, valCol,  &lParse.valCol, status );
   if( *status ) return( *status );
   
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
      nCol = lParse.nCols;
      lParse.nCols = 0;    /*  Ignore all column references  */
   } else
      constant = 0;

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   /*******************************************/
   /* Allocate data arrays for each parameter */
   /*******************************************/
   
   parNo = lParse.nCols;
   while( parNo-- ) {
      switch( lParse.colData[parNo].datatype ) {
      case TLONG:
         if( (lParse.colData[parNo].array =
              (long *)malloc( (ntimes+1)*sizeof(long) )) )
            ((long*)lParse.colData[parNo].array)[0] = 1234554321;
         else
            *status = MEMORY_ALLOCATION;
         break;
      case TDOUBLE:
         if( (lParse.colData[parNo].array =
              (double *)malloc( (ntimes+1)*sizeof(double) )) )
            ((double*)lParse.colData[parNo].array)[0] = DOUBLENULLVALUE;
         else
            *status = MEMORY_ALLOCATION;
         break;
      case TSTRING:
         if( !fits_get_coltype( fptr, lParse.valCol, &typecode,
                                &alen, &width, status ) ) {
            alen++;
            if( (lParse.colData[parNo].array =
                 (char **)malloc( (ntimes+1)*sizeof(char*) )) ) {
               if( (((char **)lParse.colData[parNo].array)[0] =
                    (char *)malloc( (ntimes+1)*sizeof(char)*alen )) ) {
                  for( elem=1; elem<=ntimes; elem++ )
                     ((char **)lParse.colData[parNo].array)[elem] =
                        ((char **)lParse.colData[parNo].array)[elem-1]+alen;
                  ((char **)lParse.colData[parNo].array)[0][0] = '\0';
               } else {
                  free( lParse.colData[parNo].array );
                  *status = MEMORY_ALLOCATION;
               }
            } else {
               *status = MEMORY_ALLOCATION;
            }
         }
         break;
      }
      if( *status ) {
         while( parNo-- ) {
            if( lParse.colData[parNo].datatype==TSTRING )
               FREE( ((char **)lParse.colData[parNo].array)[0] );
            FREE( lParse.colData[parNo].array );
         }
         return( *status );
      }
   }
   
   /**********************************************************************/
   /* Read data from columns needed for the expression and then parse it */
   /**********************************************************************/
   
   if( !fits_uncompress_hkdata( &lParse, fptr, ntimes, times, status ) ) {
      if( constant ) {
         result = lParse.Nodes[lParse.resultNode].value.data.log;
         elem = ntimes;
         while( elem-- ) time_status[elem] = result;
      } else {
         Info.dataPtr  = time_status;
         Info.nullPtr  = NULL;
         Info.maxRows  = ntimes;
         *status       = fits_parser_workfn( ntimes, 0, 1, ntimes, lParse.nCols,
                                     lParse.colData, (void*)&Info );
      }
   }
   
   /************/
   /* Clean up */
   /************/
   
   parNo = lParse.nCols;
   while ( parNo-- ) {
      if( lParse.colData[parNo].datatype==TSTRING )
         FREE( ((char **)lParse.colData[parNo].array)[0] );
      FREE( lParse.colData[parNo].array );
   }
   
   if( constant ) lParse.nCols = nCol;

   ffcprs(&lParse);
   return(*status);
}